

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::OutOfRange::OutOfRange(OutOfRange *this,size_t index,size_t size)

{
  undefined1 local_f0 [48];
  undefined1 local_c0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  size_t local_20;
  size_t size_local;
  size_t index_local;
  OutOfRange *this_local;
  
  local_20 = size;
  size_local = index;
  index_local = (size_t)this;
  Error::str<unsigned_long>((Error *)local_c0,index);
  std::operator+(local_c0 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"the index (")
  ;
  std::operator+(local_80,local_c0 + 0x20);
  Error::str<unsigned_long>((Error *)local_f0,local_20 - 1);
  std::operator+(local_60,local_80);
  std::operator+(local_40,(char *)local_60);
  Error::Error(&this->super_Error,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(local_c0 + 0x20));
  std::__cxx11::string::~string((string *)local_c0);
  *(undefined ***)&this->super_Error = &PTR__OutOfRange_001fd188;
  return;
}

Assistant:

OutOfRange::OutOfRange(std::size_t index, std::size_t size)
    : Error("the index (" + str(index) + ") is out of the allowed range [0, " + str(size - 1) + "]")
{
}